

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoopLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loop(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LoopLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_loop(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loop(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LoopLayerParams>(arena);
    (this->layer_).loop_ = pLVar2;
  }
  return (LoopLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopLayerParams* NeuralNetworkLayer::_internal_mutable_loop() {
  if (!_internal_has_loop()) {
    clear_layer();
    set_has_loop();
    layer_.loop_ = CreateMaybeMessage< ::CoreML::Specification::LoopLayerParams >(GetArenaForAllocation());
  }
  return layer_.loop_;
}